

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O1

void __thiscall
wigwag::detail::
signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
::invoke<CollectionOp&,int_const&,std::__cxx11::string_const&>
          (signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
           *this,CollectionOp *args,int *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  *psVar1;
  int iVar2;
  signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  *psVar3;
  long *plVar4;
  signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  *psVar5;
  iterator tmp;
  signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  *psVar6;
  bool bVar7;
  execution_guard g;
  execution_guard local_48;
  
  threading::shared_recursive_mutex::lock_primitive::lock_recursive((lock_primitive *)(this + 0x70))
  ;
  psVar3 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
             **)(this + 0xa0);
  if (this + 0xa0 != psVar3 ||
      *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
        **)(this + 0xa8) != this + 0xa0) {
    psVar6 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
               **)(this + 0xa8);
    do {
      if (*(int *)(psVar6 + -4) == 1) {
        psVar1 = psVar6 + -4;
        psVar5 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                   **)(psVar6 + 8);
        LOCK();
        *(int *)psVar1 = *(int *)psVar1 + -1;
        UNLOCK();
        if (*(int *)psVar1 == 0) {
          plVar4 = *(long **)(psVar6 + 8);
          *plVar4 = *(long *)psVar6;
          *(long **)(*(long *)psVar6 + 8) = plVar4;
          *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
            **)(psVar6 + 8) = psVar6;
          *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
            **)psVar6 = psVar6;
          (**(code **)(*(long *)(psVar6 + -0x18) + 0x10))(psVar6 + -0x18);
        }
      }
      else {
        local_48._la = (life_assurance *)(psVar6 + -0x10);
        LOCK();
        psVar5 = psVar6 + -8;
        iVar2 = *(int *)psVar5;
        *(int *)psVar5 = *(int *)psVar5 + 1;
        UNLOCK();
        local_48._alive = iVar2 + 1U & 0x80000000;
        local_48._sd = (shared_data *)(this + 0x18);
        if (local_48._alive == 0) {
          life_assurance::intrusive_life_tokens::execution_guard::unlock(&local_48);
        }
        if (local_48._alive != 0) {
          exception_handling::print_to_stderr::
          handle_exceptions<std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>&,CollectionOp&,int_const&,std::__cxx11::string_const&>
                    ((print_to_stderr *)(this + 8),
                     (function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)(psVar6 + 0x18),args,args_1,args_2);
        }
        psVar5 = *(signal_impl<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                   **)(psVar6 + 8);
        life_assurance::intrusive_life_tokens::execution_guard::~execution_guard(&local_48);
      }
      bVar7 = psVar6 != psVar3;
      psVar6 = psVar5;
    } while (bVar7);
  }
  pthread_mutex_unlock(*(pthread_mutex_t **)(this + 0x70));
  return;
}

Assistant:

void invoke(Args_&&... args)
        {
            this->get_lock_primitive().lock_recursive();
            auto sg = detail::at_scope_exit([&] { this->get_lock_primitive().unlock_recursive(); } );

            if (this->_handlers.empty())
                return;
            auto it = this->_handlers.begin(), e = this->_handlers.pre_end();

            bool last_iter = false;
            while (!last_iter)
            {
                last_iter = it == e;

                if (it->should_be_finalized())
                {
                    (it++)->finalize_node();
                    continue;
                }

                execution_guard g(listenable_base::get_life_assurance_shared_data(), it->get_life_assurance());
                if (g.is_alive())
                    this->get_exception_handler().handle_exceptions(it->get_handler(), std::forward<Args_>(args)...);
                ++it;
            }
        }